

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinholecamera.hpp
# Opt level: O1

void __thiscall PinholeCamera::PinholeCamera(PinholeCamera *this,Json *conf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ulong uVar7;
  int iVar14;
  int iVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  Camera::Camera(&this->super_Camera,conf);
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR_sampleray_0016ccb8;
  *(undefined8 *)&(this->super_Camera).field_0x3c = 0;
  *(undefined8 *)&this->field_0x44 = 0;
  (this->uphalf).y = 0.0;
  (this->uphalf).z = 0.0;
  (this->lefthalf).x = 0.0;
  (this->lefthalf).y = 0.0;
  (this->lefthalf).z = 0.0;
  fVar19 = (this->super_Camera).look_at.z - (this->super_Camera).position.z;
  uVar1 = (this->super_Camera).position.x;
  uVar8 = (this->super_Camera).position.y;
  uVar2 = (this->super_Camera).look_at.x;
  uVar9 = (this->super_Camera).look_at.y;
  fVar21 = (float)uVar2 - (float)uVar1;
  fVar22 = (float)uVar9 - (float)uVar8;
  fVar17 = fVar19 * fVar19 + fVar21 * fVar21 + fVar22 * fVar22;
  if (fVar17 < 0.0) {
    fVar17 = sqrtf(fVar17);
  }
  else {
    fVar17 = SQRT(fVar17);
  }
  fVar17 = 1.0 / fVar17;
  fVar19 = fVar19 * fVar17;
  fVar21 = fVar21 * fVar17;
  fVar22 = fVar22 * fVar17;
  *(ulong *)&(this->super_Camera).field_0x3c = CONCAT44(fVar22,fVar21);
  *(float *)&this->field_0x44 = fVar19;
  uVar3 = (this->super_Camera).up.x;
  uVar10 = (this->super_Camera).up.y;
  uVar4 = (this->super_Camera).up.y;
  uVar11 = (this->super_Camera).up.z;
  fVar23 = (this->super_Camera).up.z * fVar21 - fVar19 * (float)uVar3;
  fVar17 = (float)uVar3 * fVar22 - (float)uVar4 * fVar21;
  fVar18 = (float)uVar10 * fVar19 - (float)uVar11 * fVar22;
  fVar20 = fVar22 * fVar17 - fVar23 * fVar19;
  fVar19 = fVar19 * fVar18 - fVar17 * fVar21;
  fVar21 = fVar23 * fVar21 - fVar18 * fVar22;
  fVar17 = fVar21 * fVar21 + fVar20 * fVar20 + fVar19 * fVar19;
  if (fVar17 < 0.0) {
    fVar17 = sqrtf(fVar17);
  }
  else {
    fVar17 = SQRT(fVar17);
  }
  fVar17 = 1.0 / fVar17;
  (this->super_Camera).up.x = fVar17 * fVar20;
  (this->super_Camera).up.y = fVar17 * fVar19;
  (this->super_Camera).up.z = fVar17 * fVar21;
  fVar17 = *(float *)&(this->super_Camera).field_0x3c;
  fVar17 = *(float *)&this->field_0x44 * *(float *)&this->field_0x44 +
           fVar17 * fVar17 + *(float *)&this->field_0x40 * *(float *)&this->field_0x40;
  if (fVar17 < 0.0) {
    fVar17 = sqrtf(fVar17);
  }
  else {
    fVar17 = SQRT(fVar17);
  }
  iVar14 = (this->super_Camera).resy;
  iVar15 = (this->super_Camera).resx;
  dVar16 = tan((double)((this->super_Camera).fov * 0.5));
  fVar19 = (float)(dVar16 * (double)(((float)iVar14 * fVar17) / (float)iVar15));
  uVar5 = (this->super_Camera).up.x;
  uVar12 = (this->super_Camera).up.y;
  uVar6 = (this->super_Camera).up.y;
  uVar13 = (this->super_Camera).up.z;
  fVar17 = (this->super_Camera).up.z;
  (this->uphalf).x = fVar19 * (float)uVar5;
  (this->uphalf).y = fVar19 * (float)uVar12;
  (this->uphalf).z = fVar19 * fVar17;
  fVar19 = *(float *)&(this->super_Camera).field_0x3c;
  fVar22 = (float)*(undefined8 *)&this->field_0x40;
  fVar18 = (float)((ulong)*(undefined8 *)&this->field_0x40 >> 0x20);
  dVar16 = tan((double)((this->super_Camera).fov * 0.5));
  fVar21 = (float)dVar16;
  (this->lefthalf).x = fVar21 * (fVar18 * (float)uVar6 - fVar17 * fVar22);
  (this->lefthalf).y = fVar21 * (fVar19 * (float)uVar13 - (float)uVar5 * fVar18);
  (this->lefthalf).z = ((float)uVar5 * fVar22 - (float)uVar12 * fVar19) * fVar21;
  if ((this->super_Camera).mirror == true) {
    uVar7._0_4_ = (this->lefthalf).x;
    uVar7._4_4_ = (this->lefthalf).y;
    (this->lefthalf).x = (float)(int)(uVar7 ^ 0x8000000080000000);
    (this->lefthalf).y = (float)(int)((uVar7 ^ 0x8000000080000000) >> 0x20);
    (this->lefthalf).z = -(this->lefthalf).z;
  }
  return;
}

Assistant:

PinholeCamera(const Json& conf): Camera(conf) {
		dir = normalized(look_at - position);
		up = normalized(cross(dir, cross(up, dir)));
		uphalf = norm(dir) * resy / resx * tan(fov/2) * up;
		lefthalf = cross(up, dir) * tan(fov/2);
		if (mirror) lefthalf = -lefthalf;
	}